

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O1

void __thiscall sentencepiece::unigram::Model::PopulateNodes(Model *this,Lattice *lattice)

{
  float fVar1;
  int iVar2;
  byte *pbVar3;
  unit_type *puVar4;
  byte *pbVar5;
  void *pvVar6;
  ulong uVar7;
  ostream *poVar8;
  Node *pNVar9;
  byte bVar10;
  undefined8 *puVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  int length;
  Model *pMVar16;
  ulong uVar17;
  bool bVar18;
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  trie_results;
  Die local_7d;
  float local_7c;
  Lattice *local_78;
  ulong local_70;
  Model *local_68;
  char *local_60;
  long local_58;
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  local_50;
  ulong local_38;
  
  local_7c = this->min_score_;
  uVar12 = (int)((ulong)((long)(lattice->surface_).
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(lattice->surface_).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  sVar14 = (lattice->sentence_)._M_len;
  local_60 = (lattice->sentence_)._M_str;
  local_68 = this;
  std::
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  ::vector(&local_50,(long)this->trie_results_size_ + 1,(allocator_type *)&local_7d);
  if (0 < (int)uVar12) {
    local_7c = local_7c + -10.0;
    local_60 = local_60 + (int)sVar14;
    local_38 = (ulong)uVar12;
    local_58 = 0;
    uVar17 = 0;
    local_78 = lattice;
    do {
      pMVar16 = local_68;
      pbVar3 = (byte *)(lattice->surface_).
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar17];
      uVar7 = (long)local_50.
                    super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_50.
                    super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      puVar4 = ((local_68->trie_)._M_t.
                super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                .super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>.
               _M_head_impl)->array_;
      uVar13 = (ulong)((puVar4->unit_ >> 10) << ((byte)(puVar4->unit_ >> 6) & 8));
      if (((long)local_60 - (long)pbVar3 & 0xffffffffU) == 0) {
        bVar10 = *pbVar3;
        if (bVar10 == 0) {
          uVar15 = 0;
        }
        else {
          sVar14 = 1;
          uVar15 = 0;
          do {
            uVar12 = puVar4[bVar10 ^ uVar13].unit_;
            if ((uVar12 & 0x800000ff) != (uint)bVar10) break;
            uVar13 = bVar10 ^ uVar13 ^ (ulong)((uVar12 >> 10) << ((byte)(uVar12 >> 6) & 8));
            if ((uVar12 >> 8 & 1) != 0) {
              if (uVar15 < uVar7) {
                local_50.
                super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].value =
                     puVar4[uVar13].unit_ & 0x7fffffff;
                local_50.
                super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].length = sVar14;
              }
              uVar15 = uVar15 + 1;
            }
            bVar10 = pbVar3[sVar14];
            sVar14 = sVar14 + 1;
          } while (bVar10 != 0);
        }
      }
      else {
        uVar15 = 0;
        sVar14 = 1;
        do {
          uVar13 = pbVar3[sVar14 - 1] ^ uVar13;
          uVar12 = puVar4[uVar13].unit_;
          if ((uVar12 & 0x800000ff) != (uint)pbVar3[sVar14 - 1]) break;
          uVar13 = uVar13 ^ (uVar12 >> 10) << ((byte)(uVar12 >> 6) & 8);
          if ((uVar12 >> 8 & 1) != 0) {
            if (uVar15 < uVar7) {
              local_50.
              super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar15].value =
                   puVar4[uVar13].unit_ & 0x7fffffff;
              local_50.
              super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar15].length = sVar14;
            }
            uVar15 = uVar15 + 1;
          }
          bVar18 = sVar14 != (long)(int)((long)local_60 - (long)pbVar3);
          sVar14 = sVar14 + 1;
        } while (bVar18);
      }
      local_70 = uVar17;
      if (uVar7 <= uVar15) {
        local_7d.die_ = true;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unigram_model.cc",0x10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,0x23a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"(num_nodes) < (trie_results.size())",0x23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
        error::Die::~Die(&local_7d);
      }
      lattice = local_78;
      if (uVar15 == 0) {
LAB_001f6ee0:
        pNVar9 = Lattice::Insert(lattice,(int)local_70,1);
        pNVar9->id = (pMVar16->super_ModelInterface).unk_id_;
        pNVar9->score = local_7c;
        lattice = local_78;
      }
      else {
        uVar17 = 0;
        bVar18 = false;
        do {
          length = -1;
          puVar11 = (undefined8 *)
                    ((long)(lattice->surface_).
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_start + local_58);
          do {
            length = length + 1;
            pbVar5 = (byte *)*puVar11;
            puVar11 = puVar11 + 1;
          } while (pbVar5 < pbVar3 + local_50.
                                     super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar17].length);
          iVar2 = local_50.
                  super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar17].value;
          if (*(int *)((long)((((pMVar16->super_ModelInterface).model_proto_)->pieces_).
                              super_RepeatedPtrFieldBase.rep_)->elements[iVar2] + 0x3c) != 5) {
            pNVar9 = Lattice::Insert(lattice,(int)local_70,length);
            pNVar9->id = iVar2;
            pvVar6 = ((((local_68->super_ModelInterface).model_proto_)->pieces_).
                      super_RepeatedPtrFieldBase.rep_)->elements[iVar2];
            if (*(int *)((long)pvVar6 + 0x3c) == 4) {
              fVar1 = (float)length * local_68->max_score_ + -0.1;
            }
            else {
              fVar1 = *(float *)((long)pvVar6 + 0x38);
            }
            pNVar9->score = fVar1;
            lattice = local_78;
            if ((!bVar18) && (pNVar9->length == 1)) {
              bVar18 = true;
            }
          }
          uVar17 = uVar17 + 1;
          pMVar16 = local_68;
        } while (uVar17 != uVar15);
        if (!bVar18) goto LAB_001f6ee0;
      }
      uVar17 = local_70 + 1;
      local_58 = local_58 + 8;
    } while (uVar17 != local_38);
  }
  if (local_50.
      super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Model::PopulateNodes(Lattice *lattice) const {
  auto get_chars_length = [&lattice](int begin_pos, const char *end) {
    int pos = begin_pos;
    while (lattice->surface(pos) < end) ++pos;
    return pos - begin_pos;
  };

  const float unk_score = min_score() - kUnkPenalty;

  const int len = lattice->size();
  const char *end = lattice->sentence() + lattice->utf8_size();

  // +1 just in case.
  std::vector<Darts::DoubleArray::result_pair_type> trie_results(
      trie_results_size_ + 1);

  for (int begin_pos = 0; begin_pos < len; ++begin_pos) {
    const char *begin = lattice->surface(begin_pos);

    // Finds all pieces which are prefix of surface(begin_pos).
    const size_t num_nodes = trie_->commonPrefixSearch(
        begin, trie_results.data(), trie_results.size(),
        static_cast<int>(end - begin));
    CHECK_LT(num_nodes, trie_results.size());

    bool has_single_node = false;

    // Inserts pieces to the lattice.
    for (size_t k = 0; k < num_nodes; ++k) {
      const int length =
          get_chars_length(begin_pos, begin + trie_results[k].length);
      const int id = trie_results[k].value;
      if (IsUnusedInlined(id)) continue;
      Lattice::Node *node = lattice->Insert(begin_pos, length);
      node->id = id;  // the value of Trie stores vocab_id.
      // User defined symbol receives extra bonus to always be selected.
      node->score = IsUserDefinedInlined(id) ? (length * max_score_ - 0.1)
                                             : GetScoreInlined(id);
      if (!has_single_node && node->length == 1) {
        has_single_node = true;
      }
    }

    if (!has_single_node) {
      Lattice::Node *node = lattice->Insert(begin_pos, 1);
      node->id = unk_id_;  // add UNK node.
      node->score = unk_score;
    }
  }
}